

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::Binder::PlanSubquery
          (Binder *this,BoundSubqueryExpression *expr,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root)

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  LogicalType *other;
  vector<duckdb::LogicalType,_true> *this_01;
  char cVar1;
  ExpressionType EVar2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  ulong uVar4;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  _func_int **pp_Var6;
  ColumnBinding binding;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *puVar7;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var8;
  undefined1 auVar9 [8];
  undefined8 uVar10;
  bool bVar11;
  Binder *pBVar12;
  pointer pLVar13;
  pointer pLVar14;
  reference pvVar15;
  BoundAtClause *pBVar16;
  LogicalLimit *this_02;
  pointer this_03;
  ClientConfig *pCVar17;
  BoundColumnRefExpression *pBVar18;
  LogicalOperator *aggregate_index;
  LogicalOperator *table_index;
  pointer pEVar19;
  __uniq_ptr_impl<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>_>
  this_04;
  BoundComparisonExpression *this_05;
  BoundConstantExpression *this_06;
  pointer pBVar20;
  pointer pBVar21;
  ClientContext *pCVar22;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> this_07;
  pointer pLVar23;
  reference pvVar24;
  reference pvVar25;
  pointer pBVar26;
  idx_t iVar27;
  idx_t group_index;
  pointer pLVar28;
  _Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false> this_08;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var29;
  tuple<duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_> this_09;
  LogicalDependentJoin *table_index_00;
  LogicalProjection *this_10;
  pointer pLVar30;
  type op;
  NotImplementedException *this_11;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RCX;
  long lVar31;
  _Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false> _Var32;
  undefined8 *puVar33;
  undefined8 *puVar34;
  pointer *__ptr;
  vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns;
  size_type __n;
  byte bVar35;
  ColumnBinding binding_00;
  ColumnBinding binding_01;
  ColumnBinding binding_02;
  ColumnBinding binding_03;
  LogicalType idx_type;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projection_list;
  vector<duckdb::ColumnBinding,_true> bindings;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  aggregate_list;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  error_children;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  proj_expressions;
  FunctionBinder function_binder_1;
  FunctionBinder function_binder;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  count_children;
  shared_ptr<duckdb::Binder,_true> sub_binder;
  AggregateFunction count_star_fun;
  value_type plan_column;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_5c0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_5b8;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_5b0
  ;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_5a8;
  Binder *local_5a0;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_598
  ;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_590;
  _Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false> local_588;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_580;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_578;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_570;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_568;
  undefined1 local_560 [8];
  LogicalType local_558;
  undefined1 local_538 [8];
  ClientContext *pCStack_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528 [3];
  vector<duckdb::ColumnBinding,_true> local_4f8;
  undefined1 local_4d8 [8];
  element_type *peStack_4d0;
  _Alloc_hider local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  optional_idx local_4a8;
  FunctionBinder local_498;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> local_488;
  undefined1 local_480 [24];
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> local_468;
  undefined1 local_460 [8];
  undefined1 local_458 [16];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_440;
  undefined1 local_428 [32];
  undefined1 local_408 [16];
  undefined1 local_3f8 [280];
  undefined1 local_2e0 [40];
  undefined1 local_2b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_2a0 [7];
  LogicalType LStack_228;
  FunctionStability local_210;
  FunctionNullHandling FStack_20f;
  FunctionErrors FStack_20e;
  FunctionCollationHandling FStack_20d;
  undefined8 auStack_208 [13];
  _Any_data local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  ColumnBinding local_188;
  atomic<unsigned_long> local_178;
  BaseScalarFunction local_168;
  undefined8 auStack_b8 [13];
  undefined2 local_50;
  size_type local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  
  bVar35 = 0;
  local_5b0 = root;
  local_5a0 = (Binder *)expr;
  local_598 = in_RCX;
  CreateBinder((Binder *)local_2e0,
               (ClientContext *)(expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p
               ,(optional_ptr<duckdb::Binder,_true>)expr,REGULAR_BINDER);
  pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_2e0);
  pBVar12->is_outside_flattened = false;
  pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_2e0);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(local_5b0 + 0xd));
  CreatePlan((Binder *)local_480,(BoundQueryNode *)pBVar12);
  uVar10 = local_480._0_8_;
  local_480._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  this_00 = (shared_ptr<duckdb::Binder,_true> *)(local_5b0 + 0xb);
  pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  if ((pBVar12->correlated_columns).
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pBVar12->correlated_columns).
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_590._M_head_impl = (LogicalOperator *)uVar10;
    pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
    correlated_columns = &pBVar12->correlated_columns;
    bVar11 = true;
    if (*(char *)&local_5b0[0xe].
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl == '\x04') {
LAB_00c902d1:
      pBVar16 = (BoundAtClause *)GenerateTableIndex(local_5a0);
      local_538 = (undefined1  [8])
                  (local_598->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_598->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      CreateDuplicateEliminatedJoin
                ((duckdb *)local_408,correlated_columns,MARK,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_538,bVar11);
      if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           )local_538 != (LogicalOperator *)0x0) {
        (**(code **)(*(size_type *)local_538 + 8))();
      }
      pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      pLVar13->subquery_type = ANY;
      pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      (pLVar13->super_LogicalComparisonJoin).super_LogicalJoin.mark_index = (idx_t)pBVar16;
      pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      pLVar13->any_join = true;
      if (8 < (ulong)((long)local_5b0[0x10].
                            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
                     (long)local_5b0[0xf].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)) {
        local_5b8._M_head_impl = (Expression *)this;
        this_11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_2b8._0_8_ = local_2b8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,
                   "Correlated IN/ANY/ALL with multiple columns not yet supported","");
        NotImplementedException::NotImplementedException(this_11,(string *)local_2b8);
        __cxa_throw(this_11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      local_2b8._16_8_ =
           (pLVar13->expression_children).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      _Var3._M_head_impl =
           local_5b0[0x10].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      local_2b8._0_8_ =
           (pLVar13->expression_children).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_2b8._8_8_ =
           (pLVar13->expression_children).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pLVar13->expression_children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_5b0[0xf].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pLVar13->expression_children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var3._M_head_impl;
      (pLVar13->expression_children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_5b0[0x11].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      local_5b0[0xf].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      local_5b0[0x10].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      local_5b0[0x11].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_2b8);
      pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 &pLVar13->child_types,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_5b0 + 0x13));
      pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 &pLVar13->child_targets,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_5b0 + 0x16));
      EVar2 = *(ExpressionType *)
               &local_5b0[0x12].
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      pLVar13->comparison_type = EVar2;
      pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_590._M_head_impl;
      local_590._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar13,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_4f8);
      if ((element_type *)
          local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
          super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
          super__Vector_impl_data._M_start != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                     &(local_4f8.
                       super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                       super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                       ._M_impl.super__Vector_impl_data._M_start)->table_index)->__weak_this_).
                    internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      uVar10 = local_408._0_8_;
      local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_408._0_8_ =
           (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
            )0x0;
      _Var3._M_head_impl =
           (local_598->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_598->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)uVar10;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      puVar7 = local_5b0;
      (*(code *)(((local_5b0->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_2b8,local_5b0);
      local_168.super_SimpleFunction.super_Function.name._M_dataplus._M_p = (pointer)0x0;
      local_168.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)pBVar16;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)(local_560 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                 (LogicalType *)(puVar7 + 7),(ColumnBinding *)&local_168);
    }
    else {
      bVar11 = PerformDuplicateElimination(local_5a0,correlated_columns);
      cVar1 = *(char *)&local_5b0[0xe].
                        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      if (cVar1 == '\x02') {
        pBVar16 = (BoundAtClause *)GenerateTableIndex(local_5a0);
        local_538 = (undefined1  [8])
                    (local_598->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (local_598->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        CreateDuplicateEliminatedJoin
                  ((duckdb *)local_408,correlated_columns,MARK,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_538,bVar11);
        if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             )local_538 != (LogicalOperator *)0x0) {
          (**(code **)(*(size_type *)local_538 + 8))();
        }
        pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)local_408);
        pLVar13->subquery_type = EXISTS;
        pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)local_408);
        (pLVar13->super_LogicalComparisonJoin).super_LogicalJoin.mark_index = (idx_t)pBVar16;
        pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)local_408);
        pLVar13->any_join = true;
        pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)local_408);
        local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_590._M_head_impl;
        local_590._M_head_impl = (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  ((LogicalOperator *)pLVar13,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_4f8);
        if ((element_type *)
            local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            _M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                       &(local_4f8.
                         super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                         .
                         super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                         ._M_impl.super__Vector_impl_data._M_start)->table_index)->__weak_this_).
                      internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        uVar10 = local_408._0_8_;
        local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_408._0_8_ =
             (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
              )0x0;
        _Var3._M_head_impl =
             (local_598->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (local_598->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)uVar10;
        if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        puVar7 = local_5b0;
        (*(code *)(((local_5b0->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                  expressions).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_2b8,local_5b0);
        local_168.super_SimpleFunction.super_Function.name._M_dataplus._M_p = (pointer)0x0;
        local_168.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)pBVar16;
        make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                  ((duckdb *)(local_560 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                   (LogicalType *)(puVar7 + 7),(ColumnBinding *)&local_168);
      }
      else {
        if (cVar1 != '\x01') goto LAB_00c902d1;
        local_538 = (undefined1  [8])
                    (local_598->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (local_598->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        CreateDuplicateEliminatedJoin
                  ((duckdb *)local_408,correlated_columns,SINGLE,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_538,bVar11);
        if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             )local_538 != (LogicalOperator *)0x0) {
          (**(code **)(*(size_type *)local_538 + 8))();
        }
        pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)local_408);
        pLVar13->subquery_type = SCALAR;
        pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)local_408);
        pLVar13->any_join = false;
        pLVar14 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                *)&local_590);
        (*pLVar14->_vptr_LogicalOperator[2])(local_2b8,pLVar14);
        pvVar15 = vector<duckdb::ColumnBinding,_true>::back
                            ((vector<duckdb::ColumnBinding,_true> *)local_2b8);
        local_168.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)pvVar15->table_index;
        local_168.super_SimpleFunction.super_Function.name._M_dataplus._M_p =
             (pointer)pvVar15->column_index;
        if ((_Hash_node_base *)local_2b8._0_8_ != (_Hash_node_base *)0x0) {
          operator_delete((void *)local_2b8._0_8_);
        }
        pLVar13 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)local_408);
        local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_590._M_head_impl;
        local_590._M_head_impl = (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  ((LogicalOperator *)pLVar13,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_4f8);
        if ((element_type *)
            local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            _M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                       &(local_4f8.
                         super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                         .
                         super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                         ._M_impl.super__Vector_impl_data._M_start)->table_index)->__weak_this_).
                      internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        uVar10 = local_408._0_8_;
        local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_408._0_8_ =
             (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
              )0x0;
        _Var3._M_head_impl =
             (local_598->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (local_598->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)uVar10;
        if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        puVar7 = local_5b0;
        (*(code *)(((local_5b0->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                  expressions).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_2b8,local_5b0);
        make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&>
                  ((duckdb *)(local_560 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                   (LogicalType *)(puVar7 + 7),(ColumnBinding *)&local_168);
      }
    }
    uVar10 = local_558._0_8_;
    local_558._0_8_ = (element_type *)0x0;
    if ((_Hash_node_base *)local_2b8._0_8_ != (_Hash_node_base *)(local_2b8 + 0x10)) {
      operator_delete((void *)local_2b8._0_8_);
    }
    if ((LogicalDependentJoin *)local_408._0_8_ != (LogicalDependentJoin *)0x0) {
      (**(code **)(*(undefined **)local_408._0_8_ + 8))();
    }
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar10;
    if (local_590._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_590._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_590._M_head_impl = (LogicalOperator *)0x0;
    goto LAB_00c91cfb;
  }
  local_5c0._M_head_impl = (LogicalOperator *)uVar10;
  cVar1 = *(char *)&local_5b0[0xe].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (cVar1 == '\x01') {
    local_5b8._M_head_impl = (Expression *)this;
    pLVar14 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)&local_5c0);
    (*pLVar14->_vptr_LogicalOperator[2])(&local_4f8);
    pvVar15 = vector<duckdb::ColumnBinding,_true>::operator[](&local_4f8,0);
    uVar4 = pvVar15->table_index;
    pCVar17 = ClientConfig::GetConfig
                        ((ClientContext *)(((string *)&local_5a0->context)->_M_dataplus)._M_p);
    bVar11 = pCVar17->scalar_subquery_error_on_multiple_rows;
    local_558._0_8_ = (ClientContext *)0x0;
    local_558.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_558.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pBVar18 = (BoundColumnRefExpression *)operator_new(0x70);
    other = (LogicalType *)(local_5b0 + 7);
    LogicalType::LogicalType((LogicalType *)local_2b8,other);
    binding_00.column_index = 0;
    binding_00.table_index = uVar4;
    BoundColumnRefExpression::BoundColumnRefExpression
              (pBVar18,(LogicalType *)local_2b8,binding_00,0);
    LogicalType::~LogicalType((LogicalType *)local_2b8);
    local_4d8 = (undefined1  [8])0x0;
    peStack_4d0 = (element_type *)0x0;
    local_4c8._M_p = (pointer)0x0;
    local_2b8._0_8_ = pBVar18;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)local_4d8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_2b8);
    if ((BoundColumnRefExpression *)local_2b8._0_8_ != (BoundColumnRefExpression *)0x0) {
      (*(((Expression *)local_2b8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    FunctionBinder::FunctionBinder((FunctionBinder *)local_458,local_5a0);
    FirstFunctionGetter::GetFunction((AggregateFunction *)local_2b8,other);
    local_428._0_8_ = local_4d8;
    local_428._8_8_ = peStack_4d0;
    local_428._16_8_ = local_4c8._M_p;
    local_4d8 = (undefined1  [8])0x0;
    peStack_4d0 = (element_type *)0x0;
    local_4c8._M_p = (pointer)0x0;
    local_568._M_head_impl = (LogicalOperator *)0x0;
    FunctionBinder::BindAggregateFunction
              ((FunctionBinder *)local_560,(AggregateFunction *)local_458,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_2b8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_428,(AggregateType)&local_568);
    if (local_568._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_568._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_568._M_head_impl = (LogicalOperator *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_428);
    local_2b8._0_8_ = &PTR__AggregateFunction_0196ba98;
    if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
    }
    BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_2b8);
    local_168.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)local_560;
    local_560 = (undefined1  [8])0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)(local_560 + 8),
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_168);
    if ((BoundAtClause *)local_168.super_SimpleFunction.super_Function._vptr_Function !=
        (BoundAtClause *)0x0) {
      (**(code **)((((string *)local_168.super_SimpleFunction.super_Function._vptr_Function)->
                   _M_dataplus)._M_p + 8))();
    }
    if (bVar11 != false) {
      local_408._0_8_ =
           (tuple<duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
            )0x0;
      local_408._8_8_ = (ClientContext *)0x0;
      local_3f8._0_8_ = (pointer)0x0;
      CountStarFun::GetFunction();
      local_188.table_index = local_408._0_8_;
      local_188.column_index = local_408._8_8_;
      local_178.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_3f8._0_8_;
      local_408._0_8_ =
           (__uniq_ptr_data<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true,_true>
            )0x0;
      local_408._8_8_ = (ClientContext *)0x0;
      local_3f8._0_8_ = (Binder *)0x0;
      local_570._M_head_impl = (LogicalProjection *)0x0;
      FunctionBinder::BindAggregateFunction
                ((FunctionBinder *)local_538,(AggregateFunction *)local_458,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)&local_168,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_188,(AggregateType)&local_570);
      if (local_570._M_head_impl != (LogicalProjection *)0x0) {
        (*((local_570._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      local_570._M_head_impl = (LogicalProjection *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_188);
      local_168.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_0196ba98;
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_168);
      local_4b8._M_allocated_capacity = (size_type)local_538;
      local_538 = (undefined1  [8])0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)(local_560 + 8),
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_4b8._M_allocated_capacity);
      if ((LogicalOperator *)local_4b8._M_allocated_capacity != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_4b8._M_allocated_capacity + 8))();
      }
      if (local_538 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_538 + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_408);
    }
    pBVar12 = local_5a0;
    aggregate_index = (LogicalOperator *)GenerateTableIndex(local_5a0);
    iVar27 = GenerateTableIndex(pBVar12);
    pCVar22 = (ClientContext *)operator_new(0xe0);
    local_408[0] = local_558.id_;
    local_408[1] = local_558.physical_type_;
    local_408._2_6_ = local_558._2_6_;
    local_408._8_8_ =
         local_558.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3f8._0_8_ =
         local_558.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_558._0_8_ = (element_type *)0x0;
    local_558.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_558.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LogicalAggregate::LogicalAggregate
              ((LogicalAggregate *)pCVar22,iVar27,(idx_t)aggregate_index,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_408);
    local_578._M_head_impl = (LogicalOperator *)pCVar22;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_408);
    pLVar28 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
              ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                            *)&local_578);
    local_580._M_head_impl = local_5c0._M_head_impl;
    local_5c0._M_head_impl = (LogicalOperator *)0x0;
    LogicalOperator::AddChild
              (&pLVar28->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_580);
    if ((element_type *)local_580._M_head_impl != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &(local_580._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    _Var8._M_head_impl = local_578._M_head_impl;
    _Var3._M_head_impl = local_5c0._M_head_impl;
    local_580._M_head_impl = (LogicalOperator *)0x0;
    local_578._M_head_impl = (LogicalOperator *)0x0;
    local_5c0._M_head_impl = _Var8._M_head_impl;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    this = (Binder *)local_5b8;
    if (bVar11 != false) {
      table_index = (LogicalOperator *)GenerateTableIndex(local_5a0);
      pLVar14 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_5c0);
      pvVar24 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&pLVar14->expressions,0);
      pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar24);
      pBVar18 = (BoundColumnRefExpression *)operator_new(0x70);
      LogicalType::LogicalType((LogicalType *)local_408,&pEVar19->return_type);
      binding_01.column_index = 0;
      binding_01.table_index = (idx_t)aggregate_index;
      BoundColumnRefExpression::BoundColumnRefExpression
                (pBVar18,(LogicalType *)local_408,binding_01,0);
      local_5a8._M_head_impl = (LogicalOperator *)pBVar18;
      LogicalType::~LogicalType((LogicalType *)local_408);
      pLVar14 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_5c0);
      pvVar24 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&pLVar14->expressions,1);
      pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar24);
      this_04._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
      .super__Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>._M_head_impl =
           (tuple<duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
            )operator_new(0x70);
      LogicalType::LogicalType((LogicalType *)local_408,&pEVar19->return_type);
      binding_02.column_index = 1;
      binding_02.table_index = (idx_t)aggregate_index;
      BoundColumnRefExpression::BoundColumnRefExpression
                ((BoundColumnRefExpression *)
                 this_04._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
                 .super__Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>._M_head_impl,
                 (LogicalType *)local_408,binding_02,0);
      LogicalType::~LogicalType((LogicalType *)local_408);
      Value::BIGINT((Value *)local_538,1);
      _Var29.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)operator_new(0x98);
      Value::Value((Value *)local_408,(Value *)local_538);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)
                 _Var29.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 (Value *)local_408);
      Value::~Value((Value *)local_408);
      Value::~Value((Value *)local_538);
      this_05 = (BoundComparisonExpression *)operator_new(0x68);
      local_538 = (undefined1  [8])
                  _Var29.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      local_408._0_8_ =
           this_04._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
           .super__Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>._M_head_impl;
      BoundComparisonExpression::BoundComparisonExpression
                (this_05,COMPARE_GREATERTHAN,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_408,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_538);
      this = (Binder *)local_5b8;
      local_588._M_head_impl = this_05;
      if ((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)local_538
          != (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
        (*(((Expression *)local_538)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_538 = (undefined1  [8])0x0;
      if ((LogicalDependentJoin *)local_408._0_8_ != (LogicalDependentJoin *)0x0) {
        (**(code **)(*(long *)local_408._0_8_ + 8))();
      }
      local_4b8._M_allocated_capacity = 0;
      local_4b8._8_8_ = 0;
      local_4a8.index = 0;
      Value::Value((Value *)local_538,
                   "More than one row returned by a subquery used as an expression - scalar subqueries can only return a single row.\n\nUse \"SET scalar_subquery_error_on_multiple_rows=false\" to revert to previous behavior of returning a random row."
                  );
      this_06 = (BoundConstantExpression *)operator_new(0x98);
      Value::Value((Value *)local_408,(Value *)local_538);
      BoundConstantExpression::BoundConstantExpression(this_06,(Value *)local_408);
      Value::~Value((Value *)local_408);
      local_448._M_head_impl = (LogicalOperator *)this_06;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)local_4b8._M_local_buf,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_448);
      if ((BoundConstantExpression *)local_448._M_head_impl != (BoundConstantExpression *)0x0) {
        (*(((Expression *)&(local_448._M_head_impl)->_vptr_LogicalOperator)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
      local_448._M_head_impl = (LogicalOperator *)0x0;
      Value::~Value((Value *)local_538);
      ErrorFun::GetFunction();
      local_448._M_head_impl = (LogicalOperator *)local_4b8._M_allocated_capacity;
      aStack_440._M_allocated_capacity = local_4b8._8_8_;
      aStack_440._8_8_ = local_4a8.index;
      local_4b8._M_allocated_capacity = 0;
      local_4b8._8_8_ = 0;
      local_4a8.index = 0;
      FunctionBinder::BindScalarFunction
                ((FunctionBinder *)local_460,(ScalarFunction *)local_458,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_408,SUB81(&local_448,0),(optional_ptr<duckdb::Binder,_true>)0x0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_448);
      local_408._0_8_ = &PTR__ScalarFunction_019684c8;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._272_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._272_8_);
      }
      if ((__node_base_ptr)local_3f8._176_8_ != (__node_base_ptr)0x0) {
        (*(code *)local_3f8._176_8_)(local_3f8 + 0xa0,local_3f8 + 0xa0,3);
      }
      BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_408);
      pBVar20 = unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                              *)&local_5a8);
      pBVar21 = (pointer)unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                       *)local_460);
      if (pBVar21 != pBVar20) {
        (pBVar21->super_Expression).return_type.id_ = (pBVar20->super_Expression).return_type.id_;
        (pBVar21->super_Expression).return_type.physical_type_ =
             (pBVar20->super_Expression).return_type.physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(pBVar21->super_Expression).return_type.type_info_,
                   &(pBVar20->super_Expression).return_type.type_info_);
      }
      make_uniq<duckdb::BoundCaseExpression,duckdb::unique_ptr<duckdb::BoundComparisonExpression,std::default_delete<duckdb::BoundComparisonExpression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>>
                ((duckdb *)&local_468,
                 (unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                  *)&local_588,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_460,
                 (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                  *)&local_5a8);
      local_538 = (undefined1  [8])
                  local_468._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      local_498.binder.ptr = (Binder *)0x0;
      local_498.context = (ClientContext *)0x0;
      local_488._M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
           (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
           (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
           )0x0;
      local_468._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
           (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            )0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_498,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_538);
      if (local_538 != (undefined1  [8])0x0) {
        (*(code *)((__node_base_ptr)*(_func_int ***)local_538)[1]._M_nxt)();
      }
      pCVar22 = (ClientContext *)operator_new(0x70);
      local_538 = (undefined1  [8])local_498.binder.ptr;
      pCStack_530 = local_498.context;
      local_528[0]._M_allocated_capacity =
           local_488._M_t.
           super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
           .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
      local_498.binder.ptr = (Binder *)0x0;
      local_498.context = (ClientContext *)0x0;
      local_488._M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
           (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)0x0;
      LogicalProjection::LogicalProjection
                ((LogicalProjection *)pCVar22,(idx_t)table_index,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_538);
      local_480._16_8_ = pCVar22;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_538);
      pLVar30 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                              *)(local_480 + 0x10));
      local_480._8_8_ = local_5c0._M_head_impl;
      local_5c0._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                (&pLVar30->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)(local_480 + 8));
      if ((LogicalAggregate *)local_480._8_8_ != (LogicalAggregate *)0x0) {
        (*((LogicalOperator *)local_480._8_8_)->_vptr_LogicalOperator[1])();
      }
      uVar10 = local_480._16_8_;
      _Var3._M_head_impl = local_5c0._M_head_impl;
      local_480._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_480._16_8_ = (ClientContext *)0x0;
      local_5c0._M_head_impl = (LogicalOperator *)uVar10;
      if ((_Var3._M_head_impl != (LogicalOperator *)0x0) &&
         ((*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])(),
         (ClientContext *)local_480._16_8_ != (ClientContext *)0x0)) {
        (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_480._16_8_)->
                    __weak_this_).internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_498);
      if (local_468._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           )0x0) {
        (*(code *)((__node_base_ptr)
                  *(_func_int ***)
                   local_468._M_t.
                   super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                   .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)[1]._M_nxt)
                  ();
      }
      if (local_460 != (undefined1  [8])0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_460)->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_4b8._M_local_buf);
      if (local_588._M_head_impl != (BoundComparisonExpression *)0x0) {
        (*((local_588._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                  ();
      }
      aggregate_index = table_index;
      if ((BoundColumnRefExpression *)local_5a8._M_head_impl != (BoundColumnRefExpression *)0x0) {
        (*(((Expression *)&(local_5a8._M_head_impl)->_vptr_LogicalOperator)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
    }
    puVar7 = local_598;
    local_498.binder.ptr =
         (Binder *)
         (local_598->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_598->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    local_5a8._M_head_impl = local_5c0._M_head_impl;
    local_5c0._M_head_impl = (LogicalOperator *)0x0;
    LogicalCrossProduct::Create
              ((LogicalCrossProduct *)local_538,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_498,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_5a8);
    auVar9 = local_538;
    local_538 = (undefined1  [8])0x0;
    _Var3._M_head_impl =
         (puVar7->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (puVar7->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)auVar9;
    if ((_Var3._M_head_impl != (LogicalOperator *)0x0) &&
       ((**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))(),
       (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
       local_538 != (LogicalOperator *)0x0)) {
      (**(code **)(*(long *)local_538 + 8))();
    }
    local_538 = (undefined1  [8])0x0;
    if ((ClientContext *)local_5a8._M_head_impl != (ClientContext *)0x0) {
      (*((LogicalOperator *)&(local_5a8._M_head_impl)->_vptr_LogicalOperator)->_vptr_LogicalOperator
        [1])();
    }
    local_5a8._M_head_impl = (LogicalOperator *)0x0;
    if (local_498.binder.ptr != (Binder *)0x0) {
      (*(*(_func_int ***)
          &((local_498.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
           internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>)[1])();
    }
    local_498.binder.ptr = (Binder *)0x0;
    (*(code *)(((local_5b0->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->expressions)
              .
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_538);
    local_4b8._8_8_ = 0;
    local_4b8._M_allocated_capacity = (size_type)aggregate_index;
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
              ((duckdb *)&local_588,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538,other,
               (ColumnBinding *)&local_4b8);
    _Var32._M_head_impl = local_588._M_head_impl;
    local_588._M_head_impl = (BoundComparisonExpression *)0x0;
    if (local_538 != (undefined1  [8])local_528) {
      operator_delete((void *)local_538);
    }
    if (local_578._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_578._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    if (local_560 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_560)->_M_dataplus)._M_p + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_4d8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)(local_560 + 8));
    pBVar16 = (BoundAtClause *)
              local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_start;
LAB_00c91734:
    if (pBVar16 != (BoundAtClause *)0x0) {
      operator_delete(pBVar16);
    }
  }
  else {
    if (cVar1 != '\x02') {
      local_5b8._M_head_impl = (Expression *)this;
      pLVar14 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_5c0);
      (*pLVar14->_vptr_LogicalOperator[2])(&local_168,pLVar14);
      pCVar22 = (ClientContext *)GenerateTableIndex(local_5a0);
      this_07._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )operator_new(0x118);
      LogicalComparisonJoin::LogicalComparisonJoin
                ((LogicalComparisonJoin *)
                 this_07._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,MARK,
                 LOGICAL_COMPARISON_JOIN);
      local_538 = (undefined1  [8])
                  this_07._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      pLVar23 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)local_538);
      (pLVar23->super_LogicalJoin).mark_index = (idx_t)pCVar22;
      pLVar23 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)local_538);
      local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(local_598->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_598->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar23,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_4f8);
      if ((LogicalOperator *)
          local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
          super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
          super__Vector_impl_data._M_start != (LogicalOperator *)0x0) {
        (*((_func_int **)
          (local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
           super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl
           .super__Vector_impl_data._M_start)->table_index)[1])();
      }
      local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pLVar23 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)local_538);
      local_558._0_8_ = local_5c0._M_head_impl;
      local_5c0._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar23,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)(local_560 + 8));
      local_2e0._16_8_ = pCVar22;
      if ((element_type *)local_558._0_8_ != (element_type *)0x0) {
        (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)local_558._0_8_)->
                               __weak_this_).internal.
                               super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> + 8))();
      }
      local_558._0_8_ = (element_type *)0x0;
      if (local_5b0[0x10].
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
          local_5b0[0xf].
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) {
        local_2e0._32_8_ = local_5b0 + 0xf;
        local_2e0._24_8_ = local_5b0 + 0x13;
        this_01 = (vector<duckdb::LogicalType,_true> *)(local_5b0 + 0x16);
        __n = 0;
        do {
          local_408._0_8_ = (_Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>)0x0;
          local_408._8_8_ = (element_type *)0x0;
          pvVar24 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                  *)local_2e0._32_8_,__n);
          _Var5._M_head_impl =
               (pvVar24->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          if ((__uniq_ptr_impl<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>_>
               )local_408._0_8_ !=
              (__uniq_ptr_impl<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>_>
               )0x0) {
            lVar31 = *(long *)local_408._0_8_;
            local_408._0_8_ = _Var5._M_head_impl;
            (**(code **)(lVar31 + 8))();
            _Var5._M_head_impl = (Expression *)local_408._0_8_;
          }
          local_408._0_8_ = _Var5._M_head_impl;
          pvVar25 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)local_2e0._24_8_,__n);
          pvVar15 = vector<duckdb::ColumnBinding,_true>::operator[]
                              ((vector<duckdb::ColumnBinding,_true> *)&local_168,__n);
          pBVar12 = (Binder *)operator_new(0x70);
          LogicalType::LogicalType((LogicalType *)local_2b8,pvVar25);
          binding.table_index = pvVar15->table_index;
          binding.column_index = pvVar15->column_index;
          BoundColumnRefExpression::BoundColumnRefExpression
                    ((BoundColumnRefExpression *)pBVar12,(LogicalType *)local_2b8,binding,0);
          LogicalType::~LogicalType((LogicalType *)local_2b8);
          local_428._0_8_ = pBVar12;
          pvVar25 = vector<duckdb::LogicalType,_true>::operator[](this_01,__n);
          BoundCastExpression::AddDefaultCastToType
                    ((BoundCastExpression *)local_4d8,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_428,pvVar25,false);
          uVar10 = local_408._8_8_;
          local_408._8_8_ = local_4d8;
          local_4d8 = (undefined1  [8])0x0;
          if (((element_type *)uVar10 != (element_type *)0x0) &&
             ((*(code *)(*(_Hash_node_base **)uVar10)[1]._M_nxt)(),
             local_4d8 != (undefined1  [8])0x0)) {
            (**(code **)(*(_func_int **)local_4d8 + 8))();
          }
          local_4d8 = (undefined1  [8])0x0;
          if ((Binder *)local_428._0_8_ != (Binder *)0x0) {
            (*(((Expression *)local_428._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_428._0_8_ = (Binder *)0x0;
          local_3f8[0] = *(undefined1 *)
                          &local_5b0[0x12].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          pLVar23 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                  *)local_538);
          ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
          emplace_back<duckdb::JoinCondition>
                    (&(pLVar23->conditions).
                      super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                     (JoinCondition *)local_408);
          if ((BoundComparisonExpression *)local_408._8_8_ != (BoundComparisonExpression *)0x0) {
            (**(code **)(*(long *)local_408._8_8_ + 8))();
          }
          local_408._8_8_ = (ClientContext *)0x0;
          if ((_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
               )local_408._0_8_ != (LogicalDependentJoin *)0x0) {
            (**(code **)(*(long *)local_408._0_8_ + 8))();
          }
          __n = __n + 1;
        } while (__n < (ulong)((long)local_5b0[0x10].
                                     super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                     .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                     _M_head_impl -
                               (long)local_5b0[0xf].
                                     super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                     .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                     _M_head_impl >> 3));
      }
      auVar9 = local_538;
      local_538 = (undefined1  [8])0x0;
      _Var3._M_head_impl =
           (local_598->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_598->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)auVar9;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      puVar7 = local_5b0;
      this = (Binder *)local_5b8._M_head_impl;
      (*(code *)(((local_5b0->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_2b8,local_5b0);
      local_408._0_8_ = local_2e0._16_8_;
      local_408._8_8_ = (ClientContext *)0x0;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)local_4d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                 (LogicalType *)(puVar7 + 7),(ColumnBinding *)local_408);
      _Var32._M_head_impl = (BoundComparisonExpression *)local_4d8;
      local_4d8 = (undefined1  [8])0x0;
      if ((_Hash_node_base *)local_2b8._0_8_ != (_Hash_node_base *)(local_2b8 + 0x10)) {
        operator_delete((void *)local_2b8._0_8_);
      }
      pBVar16 = (BoundAtClause *)local_168.super_SimpleFunction.super_Function._vptr_Function;
      if (local_538 != (undefined1  [8])0x0) {
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_538)->_M_allocated_capacity + 8))();
        pBVar16 = (BoundAtClause *)local_168.super_SimpleFunction.super_Function._vptr_Function;
      }
      goto LAB_00c91734;
    }
    local_5b8._M_head_impl = (Expression *)this;
    BoundLimitNode::ConstantValue((BoundLimitNode *)local_408,1);
    BoundLimitNode::BoundLimitNode((BoundLimitNode *)local_538);
    this_02 = (LogicalLimit *)operator_new(0xa8);
    local_2b8._0_8_ = local_408._0_8_;
    local_2b8._8_8_ = local_408._8_8_;
    local_2b8._16_8_ = local_3f8._0_8_;
    aaStack_2a0[0]._0_8_ = local_3f8._8_8_;
    local_3f8._8_8_ =
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    local_168.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)local_538;
    local_168.super_SimpleFunction.super_Function.name._M_dataplus._M_p = (pointer)pCStack_530;
    local_168.super_SimpleFunction.super_Function.name._M_string_length =
         local_528[0]._M_allocated_capacity;
    local_168.super_SimpleFunction.super_Function.name.field_2._M_allocated_capacity =
         local_528[0]._8_8_;
    local_528[0]._8_8_ =
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    LogicalLimit::LogicalLimit(this_02,(BoundLimitNode *)local_2b8,(BoundLimitNode *)&local_168);
    local_4b8._M_allocated_capacity = (size_type)this_02;
    if ((long *)local_168.super_SimpleFunction.super_Function.name.field_2._M_allocated_capacity !=
        (long *)0x0) {
      (**(code **)(*(long *)local_168.super_SimpleFunction.super_Function.name.field_2.
                            _M_allocated_capacity + 8))();
    }
    local_168.super_SimpleFunction.super_Function.name.field_2._M_allocated_capacity = 0;
    if ((long *)aaStack_2a0[0]._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)aaStack_2a0[0]._0_8_ + 8))();
    }
    if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
        local_528[0]._8_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_528[0]._8_8_ + 8))();
    }
    if ((Expression *)local_3f8._8_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_3f8._8_8_ + 8))();
    }
    this_03 = unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>::
              operator->((unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                          *)&local_4b8._M_allocated_capacity);
    local_448._M_head_impl = local_5c0._M_head_impl;
    local_5c0._M_head_impl = (LogicalOperator *)0x0;
    LogicalOperator::AddChild
              (&this_03->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_448);
    if ((element_type *)local_448._M_head_impl != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &(local_448._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    uVar10 = local_4b8._M_allocated_capacity;
    _Var3._M_head_impl = local_5c0._M_head_impl;
    local_448._M_head_impl = (LogicalOperator *)0x0;
    local_4b8._M_allocated_capacity = 0;
    local_5c0._M_head_impl = (LogicalOperator *)uVar10;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    CountStarFun::GetFunction();
    FunctionBinder::FunctionBinder((FunctionBinder *)local_428,local_5a0);
    SimpleFunction::SimpleFunction(&local_168.super_SimpleFunction,(SimpleFunction *)local_2b8);
    local_168.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__BaseScalarFunction_01968bd0;
    LogicalType::LogicalType(&local_168.return_type,&LStack_228);
    local_168.stability = local_210;
    local_168.null_handling = FStack_20f;
    local_168.errors = FStack_20e;
    local_168.collation_handling = FStack_20d;
    local_168.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_0196ba98;
    puVar33 = auStack_208;
    puVar34 = auStack_b8;
    for (lVar31 = 0xd; lVar31 != 0; lVar31 = lVar31 + -1) {
      *puVar34 = *puVar33;
      puVar33 = puVar33 + (ulong)bVar35 * -2 + 1;
      puVar34 = puVar34 + (ulong)bVar35 * -2 + 1;
    }
    local_50 = local_1a0._0_2_;
    local_48 = local_1a0._8_8_;
    local_40 = local_190._M_pi;
    if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_190._M_pi)->_M_use_count = (local_190._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_190._M_pi)->_M_use_count = (local_190._M_pi)->_M_use_count + 1;
      }
    }
    local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_458._0_8_ = (_Hash_node_base *)0x0;
    FunctionBinder::BindAggregateFunction
              (&local_498,(AggregateFunction *)local_428,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&local_168,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_4f8,(AggregateType)local_458);
    if ((_Hash_node_base *)local_458._0_8_ != (_Hash_node_base *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_458._0_8_)[1]._M_nxt)();
    }
    local_458._0_8_ = (_Hash_node_base *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_4f8);
    local_168.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_0196ba98;
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    BaseScalarFunction::~BaseScalarFunction(&local_168);
    pBVar26 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&local_498);
    LogicalType::LogicalType
              ((LogicalType *)(local_560 + 8),&(pBVar26->super_Expression).return_type);
    local_408._0_8_ = local_498.binder;
    local_4d8 = (undefined1  [8])0x0;
    peStack_4d0 = (element_type *)0x0;
    local_4c8._M_p = (pointer)0x0;
    local_498.binder.ptr = (Binder *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)local_4d8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_408);
    if ((LogicalDependentJoin *)local_408._0_8_ != (LogicalDependentJoin *)0x0) {
      (**(code **)(*(long *)local_408._0_8_ + 8))();
    }
    pBVar12 = local_5a0;
    iVar27 = GenerateTableIndex(local_5a0);
    group_index = GenerateTableIndex(pBVar12);
    pBVar12 = (Binder *)operator_new(0xe0);
    local_408._0_8_ = local_4d8;
    local_408._8_8_ = peStack_4d0;
    local_3f8._0_8_ = local_4c8._M_p;
    local_4d8 = (undefined1  [8])0x0;
    peStack_4d0 = (element_type *)0x0;
    local_4c8._M_p = (pointer)0x0;
    LogicalAggregate::LogicalAggregate
              ((LogicalAggregate *)pBVar12,group_index,iVar27,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_408);
    local_560 = (undefined1  [8])pBVar12;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_408);
    pLVar28 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
              ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                            *)local_560);
    local_568._M_head_impl = local_5c0._M_head_impl;
    local_5c0._M_head_impl = (LogicalOperator *)0x0;
    LogicalOperator::AddChild
              (&pLVar28->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_568);
    if ((LogicalLimit *)local_568._M_head_impl != (LogicalLimit *)0x0) {
      (*((LogicalOperator *)&(local_568._M_head_impl)->_vptr_LogicalOperator)->_vptr_LogicalOperator
        [1])();
    }
    auVar9 = local_560;
    _Var3._M_head_impl = local_5c0._M_head_impl;
    local_568._M_head_impl = (LogicalOperator *)0x0;
    local_560 = (undefined1  [8])0x0;
    local_5c0._M_head_impl = (LogicalOperator *)auVar9;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    this_08._M_head_impl = (LogicalDependentJoin *)operator_new(0x70);
    LogicalType::LogicalType((LogicalType *)local_408,(LogicalType *)(local_560 + 8));
    binding_03.column_index = 0;
    binding_03.table_index = iVar27;
    BoundColumnRefExpression::BoundColumnRefExpression
              ((BoundColumnRefExpression *)this_08._M_head_impl,(LogicalType *)local_408,binding_03,
               0);
    LogicalType::~LogicalType((LogicalType *)local_408);
    Value::Numeric((Value *)local_538,(LogicalType *)(local_560 + 8),1);
    _Var29.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)operator_new(0x98);
    Value::Value((Value *)local_408,(Value *)local_538);
    BoundConstantExpression::BoundConstantExpression
              ((BoundConstantExpression *)
               _Var29.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
               (Value *)local_408);
    Value::~Value((Value *)local_408);
    Value::~Value((Value *)local_538);
    this_09.
    super__Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
    .super__Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
          )operator_new(0x68);
    local_538 = (undefined1  [8])
                _Var29.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_408._0_8_ = this_08._M_head_impl;
    BoundComparisonExpression::BoundComparisonExpression
              ((BoundComparisonExpression *)
               this_09.
               super__Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
               .super__Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>._M_head_impl,
               COMPARE_BOUNDARY_START,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_408,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_538);
    if ((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)local_538
        != (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
      (*(((Expression *)local_538)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_538 = (undefined1  [8])0x0;
    if ((_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
         )local_408._0_8_ != (LogicalDependentJoin *)0x0) {
      (**(code **)(*(long *)local_408._0_8_ + 8))();
    }
    local_538 = (undefined1  [8])0x0;
    pCStack_530 = (ClientContext *)0x0;
    local_528[0]._M_allocated_capacity = (Binder *)0x0;
    local_408._0_8_ =
         this_09.
         super__Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
         .super__Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)local_538,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_408);
    if ((_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
         )local_408._0_8_ != (LogicalDependentJoin *)0x0) {
      (**(code **)(*(long *)local_408._0_8_ + 8))();
    }
    table_index_00 = (LogicalDependentJoin *)GenerateTableIndex(local_5a0);
    this_10 = (LogicalProjection *)operator_new(0x70);
    local_408._0_8_ = local_538;
    local_408._8_8_ = pCStack_530;
    local_3f8._0_8_ = local_528[0]._M_allocated_capacity;
    local_538 = (undefined1  [8])0x0;
    pCStack_530 = (ClientContext *)0x0;
    local_528[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LogicalProjection::LogicalProjection
              (this_10,(idx_t)table_index_00,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_408);
    local_570._M_head_impl = this_10;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_408);
    pLVar30 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)&local_570);
    this = (Binder *)local_5b8;
    local_578._M_head_impl = local_5c0._M_head_impl;
    local_5c0._M_head_impl = (LogicalOperator *)0x0;
    LogicalOperator::AddChild
              (&pLVar30->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_578);
    if ((LogicalAggregate *)local_578._M_head_impl != (LogicalAggregate *)0x0) {
      (*((LogicalOperator *)&(local_578._M_head_impl)->_vptr_LogicalOperator)->_vptr_LogicalOperator
        [1])();
    }
    local_5a8._M_head_impl = &(local_570._M_head_impl)->super_LogicalOperator;
    _Var3._M_head_impl = local_5c0._M_head_impl;
    local_578._M_head_impl = (LogicalOperator *)0x0;
    local_570._M_head_impl = (LogicalProjection *)0x0;
    local_5c0._M_head_impl = local_5a8._M_head_impl;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
      local_5a8._M_head_impl = local_5c0._M_head_impl;
    }
    puVar7 = local_598;
    local_580._M_head_impl =
         (local_598->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_598->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    local_5c0._M_head_impl = (LogicalOperator *)0x0;
    LogicalCrossProduct::Create
              ((LogicalCrossProduct *)local_408,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_580,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_5a8);
    uVar10 = local_408._0_8_;
    local_408._0_8_ = (_Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>)0x0;
    _Var3._M_head_impl =
         (puVar7->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (puVar7->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)uVar10;
    if ((_Var3._M_head_impl != (LogicalOperator *)0x0) &&
       ((**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))(),
       (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
        )local_408._0_8_ != (LogicalDependentJoin *)0x0)) {
      (**(code **)(*(long *)local_408._0_8_ + 8))();
    }
    local_408._0_8_ =
         (tuple<duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>)
         0x0;
    if ((LogicalProjection *)local_5a8._M_head_impl != (LogicalProjection *)0x0) {
      (*((LogicalOperator *)&(local_5a8._M_head_impl)->_vptr_LogicalOperator)->_vptr_LogicalOperator
        [1])();
    }
    local_5a8._M_head_impl = (LogicalOperator *)0x0;
    if (local_580._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_580._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_580._M_head_impl = (LogicalOperator *)0x0;
    (*(code *)(((local_5b0->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->expressions)
              .
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_408);
    local_188.column_index = 0;
    local_188.table_index = (idx_t)table_index_00;
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalTypeId_const&,duckdb::ColumnBinding>
              ((duckdb *)&local_588,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408,
               &LogicalType::BOOLEAN,&local_188);
    _Var32._M_head_impl = local_588._M_head_impl;
    local_588._M_head_impl = (BoundComparisonExpression *)0x0;
    if ((ClientContext *)local_408._0_8_ != (ClientContext *)local_3f8) {
      operator_delete((void *)local_408._0_8_);
    }
    if (local_570._M_head_impl != (LogicalProjection *)0x0) {
      (*((local_570._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_538);
    if (local_560 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_560)->_M_dataplus)._M_p + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_4d8);
    LogicalType::~LogicalType((LogicalType *)(local_560 + 8));
    if (local_498.binder.ptr != (Binder *)0x0) {
      (*(((LogicalComparisonJoin *)
         &(local_498.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>)->super_LogicalJoin)
        .super_LogicalOperator._vptr_LogicalOperator[1])();
    }
    local_2b8._0_8_ = &PTR__AggregateFunction_0196ba98;
    if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
    }
    BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_2b8);
    if ((LogicalOperator *)local_4b8._M_allocated_capacity != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_4b8._M_allocated_capacity + 8))();
    }
  }
  pp_Var6 = (((Expression *)this)->super_BaseExpression)._vptr_BaseExpression;
  (((Expression *)this)->super_BaseExpression)._vptr_BaseExpression =
       (_func_int **)_Var32._M_head_impl;
  if (pp_Var6 != (_func_int **)0x0) {
    (**(code **)(*pp_Var6 + 8))();
  }
  if (local_5c0._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_5c0._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_5c0._M_head_impl = (LogicalOperator *)0x0;
LAB_00c91cfb:
  pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_2e0);
  if (pBVar12->has_unplanned_dependent_joins == true) {
    local_2b8._0_8_ = &PTR__RecursiveDependentJoinPlanner_019a0438;
    local_2b8._8_8_ = (pointer)0x0;
    local_2b8._16_8_ = local_5a0;
    op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
         operator*(local_598);
    RecursiveDependentJoinPlanner::VisitOperator((RecursiveDependentJoinPlanner *)local_2b8,op);
    local_2b8._0_8_ = &PTR__RecursiveDependentJoinPlanner_019a0438;
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      (*(code *)(*(_Hash_node_base **)local_2b8._8_8_)[1]._M_nxt)();
    }
  }
  if ((Expression *)local_480._0_8_ != (Expression *)0x0) {
    (**(code **)(*(long *)local_480._0_8_ + 8))();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> Binder::PlanSubquery(BoundSubqueryExpression &expr, unique_ptr<LogicalOperator> &root) {
	D_ASSERT(root);
	// first we translate the QueryNode of the subquery into a logical plan
	auto sub_binder = Binder::CreateBinder(context, this);
	sub_binder->is_outside_flattened = false;
	auto subquery_root = sub_binder->CreatePlan(*expr.subquery);
	D_ASSERT(subquery_root);

	// now we actually flatten the subquery
	auto plan = std::move(subquery_root);

	unique_ptr<Expression> result_expression;
	if (!expr.IsCorrelated()) {
		result_expression = PlanUncorrelatedSubquery(*this, expr, root, std::move(plan));
	} else {
		result_expression = PlanCorrelatedSubquery(*this, expr, root, std::move(plan));
	}
	// finally, we recursively plan the nested subqueries (if there are any)
	if (sub_binder->has_unplanned_dependent_joins) {
		RecursiveDependentJoinPlanner plan(*this);
		plan.VisitOperator(*root);
	}
	return result_expression;
}